

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool array_container_remove(array_container_t *arr,uint16_t pos)

{
  int32_t iVar1;
  _Bool is_present;
  int32_t idx;
  uint16_t pos_local;
  array_container_t *arr_local;
  
  iVar1 = binarySearch(arr->array,arr->cardinality,pos);
  if (-1 < iVar1) {
    memmove(arr->array + iVar1,arr->array + (long)iVar1 + 1,
            (long)((arr->cardinality - iVar1) + -1) << 1);
    arr->cardinality = arr->cardinality + -1;
  }
  return -1 < iVar1;
}

Assistant:

static inline bool array_container_remove(array_container_t *arr,
                                          uint16_t pos) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, pos);
    const bool is_present = idx >= 0;
    if (is_present) {
        memmove(arr->array + idx, arr->array + idx + 1,
                (arr->cardinality - idx - 1) * sizeof(uint16_t));
        arr->cardinality--;
    }

    return is_present;
}